

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::virtualMemoryInit(Forth *this)

{
  CAddr CVar1;
  
  virtualMemorySegmentInit(this,vmSegmentVariables,0x10000);
  CVar1 = virtualMemorySegmentInit(this,vmSegmentSourceBufferRefill,0x10000);
  setSourceVariables(this,CVar1,0,0);
  CVar1 = virtualMemorySegmentInit
                    (this,vmSegmentDataSpace,(Cell)this->FORTHSCRIPTCPP_DATASPACE_SIZE);
  this->dataPointer = CVar1;
  virtualMemorySegmentInit(this,vmSegmentParseBuffer0,0x10000);
  virtualMemorySegmentInit(this,vmSegmentParseBuffer1,0x10000);
  virtualMemorySegmentInit(this,vmSegmentParseBuffer2,0x10000);
  virtualMemorySegmentInit(this,vmSegmentParseBuffer3,0x10000);
  return;
}

Assistant:

void virtualMemoryInit(){
			const size_t sourceBufferSize = 0x010000;
			Cell start = 0, end = 0x10000; // VarOffsetSourceBuffer;
			auto addr=virtualMemorySegmentInit(vmSegmentVariables,0x10000);
			addr=virtualMemorySegmentInit(vmSegmentSourceBufferRefill,sourceBufferSize);
			setSourceVariables(addr, 0, 0); // size if 0, source is empty
			addr=virtualMemorySegmentInit(vmSegmentDataSpace,FORTHSCRIPTCPP_DATASPACE_SIZE);
			setDataPointer(addr);
			addr=virtualMemorySegmentInit(vmSegmentParseBuffer0,sourceBufferSize);
			addr=virtualMemorySegmentInit(vmSegmentParseBuffer1,sourceBufferSize);
			addr=virtualMemorySegmentInit(vmSegmentParseBuffer2,sourceBufferSize);
			addr=virtualMemorySegmentInit(vmSegmentParseBuffer3,sourceBufferSize);
		}